

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cpp
# Opt level: O0

double __thiscall wasm::WATParser::anon_unknown_22::nan(anon_unknown_22 *this,char *__tagb)

{
  Lexer *pLVar1;
  bool bVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar3;
  allocator<char> local_89;
  string local_88;
  Err local_68;
  NaNKind local_44;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  NaNKind local_2c;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  Lexer *local_18;
  Lexer *in_local;
  
  local_18 = (Lexer *)__tagb;
  in_local = (Lexer *)this;
  local_28 = sv("nan:canonical",0xd);
  bVar2 = Lexer::takeKeyword((Lexer *)__tagb,local_28);
  pLVar1 = local_18;
  if (bVar2) {
    local_2c = Canonical;
    Result<wasm::WATParser::NaNKind>::Result<wasm::WATParser::NaNKind>
              ((Result<wasm::WATParser::NaNKind> *)this,&local_2c);
    dVar3 = extraout_XMM0_Qa;
  }
  else {
    local_40 = sv("nan:arithmetic",0xe);
    bVar2 = Lexer::takeKeyword(pLVar1,local_40);
    pLVar1 = local_18;
    if (bVar2) {
      local_44 = Arithmetic;
      Result<wasm::WATParser::NaNKind>::Result<wasm::WATParser::NaNKind>
                ((Result<wasm::WATParser::NaNKind> *)this,&local_44);
      dVar3 = extraout_XMM0_Qa_00;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"expected NaN result pattern",&local_89);
      Lexer::err(&local_68,pLVar1,&local_88);
      Result<wasm::WATParser::NaNKind>::Result((Result<wasm::WATParser::NaNKind> *)this,&local_68);
      wasm::Err::~Err(&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      dVar3 = (double)std::allocator<char>::~allocator(&local_89);
    }
  }
  return dVar3;
}

Assistant:

Result<NaNKind> nan(Lexer& in) {
  if (in.takeKeyword("nan:canonical"sv)) {
    return NaNKind::Canonical;
  }
  if (in.takeKeyword("nan:arithmetic"sv)) {
    return NaNKind::Arithmetic;
  }
  return in.err("expected NaN result pattern");
}